

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Expression> __thiscall Parser::lambda(Parser *this)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ptr<Expression> pVar2;
  ptr<Function> function;
  IdentifierList parameters;
  undefined1 local_89;
  undefined1 local_88 [32];
  Function *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  ptr<Function> local_58;
  undefined1 local_48 [40];
  
  consume(in_RSI);
  consume(in_RSI,LeftParen,"\'(\'");
  identifierList_abi_cxx11_((IdentifierList *)(local_48 + 0x10),in_RSI);
  consume(in_RSI,RightParen,"\')\'");
  local_88._0_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              **)local_88,
             (allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_48 + 0x10));
  statementBlock((Parser *)local_48);
  local_68 = (Function *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Function,std::allocator<Function>,std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&,std::shared_ptr<StatementBlock>&>
            (&local_60,&local_68,(allocator<Function> *)&local_89,
             (shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_88,(shared_ptr<StatementBlock> *)local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  puVar1 = (undefined8 *)operator_new(0x88);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_0012e830;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0;
  puVar1[2] = &PTR_evaluate_00130bf0;
  puVar1[3] = puVar1 + 9;
  puVar1[4] = 1;
  puVar1[5] = 0;
  puVar1[6] = 0;
  *(undefined4 *)(puVar1 + 7) = 0x3f800000;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = puVar1 + 0x10;
  puVar1[0xb] = 1;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  *(undefined4 *)(puVar1 + 0xe) = 0x3f800000;
  puVar1[0xf] = 0;
  puVar1[0x10] = 0;
  local_88._0_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)(local_88 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"call","");
  local_58.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
  local_58.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_60._M_pi;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
    }
  }
  ObjectExpression::putFunction
            ((ObjectExpression *)(puVar1 + 2),(Identifier *)local_88,Public,&local_58);
  if (local_58.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_88._0_8_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  (this->filepath)._M_dataplus._M_p = (pointer)(puVar1 + 2);
  (this->filepath)._M_string_length = (size_type)puVar1;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_48 + 0x10));
  pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::lambda() {
    consume();
    consume(TokenType::LeftParen, "'('");
    IdentifierList parameters = identifierList();
    consume(TokenType::RightParen, "')'");

    ptr<Function> function = make<Function>(make<IdentifierList>(parameters), statementBlock());

    ptr<ObjectExpression> objectDescriptor = make<ObjectExpression>();
    objectDescriptor -> putFunction("call", Scope::Public, function);
    return objectDescriptor;
}